

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

FT_Error get_min_distance_conic(SDF_Edge *conic,FT_26D6_Vec point,SDF_Signed_Distance *out)

{
  long lVar1;
  long lVar2;
  FT_Char FVar3;
  FT_Int32 FVar4;
  FT_Int32 FVar5;
  FT_Int32 FVar6;
  FT_Int32 FVar7;
  FT_Int32 FVar8;
  FT_Int32 FVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  FT_Fixed FVar16;
  FT_Long FVar17;
  long lVar18;
  FT_16D16 temp2;
  FT_16D16 temp1;
  FT_26D6_Vec d2;
  FT_26D6_Vec d1;
  FT_16D16_Vec dist_vector;
  FT_16D16_Vec curve_point;
  FT_16D16 length;
  FT_16D16 factor2;
  FT_16D16 factor;
  FT_UShort steps;
  FT_UShort iterations;
  FT_16D16 min;
  FT_16D16 cross;
  FT_16D16 min_factor;
  FT_26D6_Vec p;
  FT_26D6_Vec p2;
  FT_26D6_Vec p1;
  FT_26D6_Vec p0;
  FT_26D6_Vec direction;
  FT_26D6_Vec nearest_point;
  FT_26D6_Vec cC;
  FT_26D6_Vec bB;
  FT_26D6_Vec aA;
  FT_Error error;
  SDF_Signed_Distance *out_local;
  SDF_Edge *conic_local;
  FT_26D6_Vec point_local;
  
  lVar18 = point.x;
  aA.y._4_4_ = 0;
  memset(&direction.y,0,0x10);
  min = 0;
  factor = 0x7fffffff;
  if ((conic == (SDF_Edge *)0x0) || (out == (SDF_Signed_Distance *)0x0)) {
    aA.y._4_4_ = 6;
  }
  else if (conic->edge_type == SDF_EDGE_CONIC) {
    lVar1 = (conic->start_pos).x;
    lVar2 = (conic->start_pos).y;
    lVar12 = (conic->control_a).x;
    lVar13 = (conic->control_a).y;
    lVar10 = lVar1 + lVar12 * -2 + (conic->end_pos).x;
    lVar11 = lVar2 + lVar13 * -2 + (conic->end_pos).y;
    lVar12 = (lVar12 - lVar1) * 2;
    lVar13 = (lVar13 - lVar2) * 2;
    factor2._2_2_ = 0;
    p0.x = lVar2;
    while( true ) {
      FVar8 = (FT_Int32)lVar10;
      FVar9 = (FT_Int32)lVar11;
      if (4 < factor2._2_2_) break;
      length = (int)((uint)factor2._2_2_ << 0x10) / 4;
      for (factor2._0_2_ = 0; (ushort)factor2 < 4; factor2._0_2_ = (ushort)factor2 + 1) {
        FVar4 = FT_MulFix_x86_64(length,length);
        FVar5 = FT_MulFix_x86_64(FVar8,FVar4);
        FVar6 = FT_MulFix_x86_64((FT_Int32)lVar12,length);
        FVar4 = FT_MulFix_x86_64(FVar9,FVar4);
        FVar7 = FT_MulFix_x86_64((FT_Int32)lVar13,length);
        lVar14 = ((FVar5 + FVar6) + lVar1) * 0x400;
        lVar15 = ((FVar4 + FVar7) + lVar2) * 0x400;
        d1.y = lVar14 + lVar18 * -0x400;
        FVar16 = FT_Vector_Length((FT_Vector *)&d1.y);
        if ((int)FVar16 < factor) {
          min = length;
          factor = (int)FVar16;
          direction.y = lVar14;
          nearest_point.x = lVar15;
        }
        FVar4 = FT_MulFix_x86_64(FVar8,length << 1);
        lVar14 = FVar4 + lVar12;
        FVar4 = FT_MulFix_x86_64(FVar9,length << 1);
        d1.x = FVar4 + lVar13;
        d1.y = d1.y / 0x400;
        lVar15 = (lVar15 + point.y * -0x400) / 0x400;
        FVar17 = FT_DivFix((long)((int)((d1.y * lVar14) / 0x40) + (int)((lVar15 * d1.x) / 0x40)),
                           (long)((int)((lVar14 * lVar14) / 0x40) + (int)((d1.x * d1.x) / 0x40) +
                                 (int)((d1.y * lVar10 * 2) / 0x40) +
                                 (int)((lVar15 * lVar11 * 2) / 0x40)));
        length = length - (int)FVar17;
        if ((length < 0) || (0x10000 < length)) break;
      }
      factor2._2_2_ = factor2._2_2_ + 1;
    }
    FVar8 = FT_MulFix_x86_64(FVar8,min);
    p0.y = (FVar8 << 1) + lVar12;
    FVar8 = FT_MulFix_x86_64(FVar9,min);
    direction.x = (FVar8 << 1) + lVar13;
    FVar8 = FT_MulFix_x86_64((int)direction.y - (int)(lVar18 << 10),(FT_Int32)direction.x);
    FVar9 = FT_MulFix_x86_64((int)nearest_point.x - (int)(point.y << 10),(FT_Int32)p0.y);
    out->distance = factor;
    FVar3 = -1;
    if (FVar8 - FVar9 < 0) {
      FVar3 = '\x01';
    }
    out->sign = FVar3;
    if ((min == 0) || (min == 0x10000)) {
      direction.y = direction.y + lVar18 * -0x400;
      FT_Vector_NormLen((FT_Vector *)&p0.y);
      FT_Vector_NormLen((FT_Vector *)&direction.y);
      FVar8 = FT_MulFix_x86_64((FT_Int32)p0.y,(int)nearest_point.x + (int)point.y * -0x400);
      FVar9 = FT_MulFix_x86_64((FT_Int32)direction.x,(FT_Int32)direction.y);
      out->cross = FVar8 - FVar9;
    }
    else {
      out->cross = 0x10000;
    }
  }
  else {
    aA.y._4_4_ = 6;
  }
  return aA.y._4_4_;
}

Assistant:

static FT_Error
  get_min_distance_conic( SDF_Edge*             conic,
                          FT_26D6_Vec           point,
                          SDF_Signed_Distance*  out )
  {
    /*
     * This method uses Newton-Raphson's approximation to find the shortest
     * distance from a point to a conic curve.  It does not involve solving
     * any cubic equation, that is why there is no risk of underflow.
     *
     * Let's assume that
     *
     * ```
     * p0 = first endpoint
     * p1 = control point
     * p3 = second endpoint
     * p  = point from which shortest distance is to be calculated
     * ```
     *
     * (1) The equation of a quadratic Bezier curve can be written as
     *
     *     ```
     *     B(t) = (1 - t)^2 * p0 + 2(1 - t)t * p1 + t^2 * p2
     *     ```
     *
     *     with `t` the factor in the range [0.0f, 1.0f].  The above
     *     equation can be rewritten as
     *
     *     ```
     *     B(t) = t^2 * (p0 - 2p1 + p2) + 2t * (p1 - p0) + p0
     *     ```
     *
     *     With
     *
     *     ```
     *     A = p0 - 2p1 + p2
     *     B = 2 * (p1 - p0)
     *     ```
     *
     *     we have
     *
     *     ```
     *     B(t) = t^2 * A + t * B + p0
     *     ```
     *
     * (2) The derivative of the above equation is
     *
     *     ```
     *     B'(t) = 2t * A + B
     *     ```
     *
     * (3) The second derivative of the above equation is
     *
     *     ```
     *     B''(t) = 2A
     *     ```
     *
     * (4) The equation `P(t)` of the distance from point `p` to the curve
     *     can be written as
     *
     *     ```
     *     P(t) = t^2 * A + t^2 * B + p0 - p
     *     ```
     *
     *     With
     *
     *     ```
     *     C = p0 - p
     *     ```
     *
     *     we have
     *
     *     ```
     *     P(t) = t^2 * A + t * B + C
     *     ```
     *
     * (5) Finally, the equation of the angle between `B(t)` and `P(t)` can
     *     be written as
     *
     *     ```
     *     Q(t) = P(t) . B'(t)
     *     ```
     *
     * (6) Our task is to find a value of `t` such that the above equation
     *     `Q(t)` becomes zero, this is, the point-to-curve vector makes
     *     90~degrees with the curve.  We solve this with the Newton-Raphson
     *     method.
     *
     * (7) We first assume an arbitary value of factor `t`, which we then
     *     improve.
     *
     *     ```
     *     t := Q(t) / Q'(t)
     *     ```
     *
     *     Putting the value of `Q(t)` from the above equation gives
     *
     *     ```
     *     t := P(t) . B'(t) / derivative(P(t) . B'(t))
     *     t := P(t) . B'(t) /
     *            (P'(t) . B'(t) + P(t) . B''(t))
     *     ```
     *
     *     Note that `P'(t)` is the same as `B'(t)` because the constant is
     *     gone due to the derivative.
     *
     * (8) Finally we get the equation to improve the factor as
     *
     *     ```
     *     t := P(t) . B'(t) /
     *            (B'(t) . B'(t) + P(t) . B''(t))
     *     ```
     *
     * [note]: `B` and `B(t)` are different in the above equations.
     */

    FT_Error  error = FT_Err_Ok;

    FT_26D6_Vec  aA, bB, cC;     /* A, B, C in the above comment          */
    FT_26D6_Vec  nearest_point = { 0, 0 };
                                 /* point on curve nearest to `point`     */
    FT_26D6_Vec  direction;      /* direction of curve at `nearest_point` */

    FT_26D6_Vec  p0, p1, p2;     /* control points of a conic curve       */
    FT_26D6_Vec  p;              /* `point` to which shortest distance    */

    FT_16D16  min_factor = 0;            /* factor at `nearest_point'     */
    FT_16D16  cross;                     /* to determine the sign         */
    FT_16D16  min        = FT_INT_MAX;   /* shortest squared distance     */

    FT_UShort  iterations;
    FT_UShort  steps;


    if ( !conic || !out )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( conic->edge_type != SDF_EDGE_CONIC )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    p0 = conic->start_pos;
    p1 = conic->control_a;
    p2 = conic->end_pos;
    p  = point;

    /* compute substitution coefficients */
    aA.x = p0.x - 2 * p1.x + p2.x;
    aA.y = p0.y - 2 * p1.y + p2.y;

    bB.x = 2 * ( p1.x - p0.x );
    bB.y = 2 * ( p1.y - p0.y );

    cC.x = p0.x;
    cC.y = p0.y;

    /* do Newton's iterations */
    for ( iterations = 0; iterations <= MAX_NEWTON_DIVISIONS; iterations++ )
    {
      FT_16D16  factor = FT_INT_16D16( iterations ) / MAX_NEWTON_DIVISIONS;
      FT_16D16  factor2;
      FT_16D16  length;

      FT_16D16_Vec  curve_point; /* point on the curve  */
      FT_16D16_Vec  dist_vector; /* `curve_point` - `p` */

      FT_26D6_Vec  d1;           /* first  derivative   */
      FT_26D6_Vec  d2;           /* second derivative   */

      FT_16D16  temp1;
      FT_16D16  temp2;


      for ( steps = 0; steps < MAX_NEWTON_STEPS; steps++ )
      {
        factor2 = FT_MulFix( factor, factor );

        /* B(t) = t^2 * A + t * B + p0 */
        curve_point.x = FT_MulFix( aA.x, factor2 ) +
                        FT_MulFix( bB.x, factor ) + cC.x;
        curve_point.y = FT_MulFix( aA.y, factor2 ) +
                        FT_MulFix( bB.y, factor ) + cC.y;

        /* convert to 16.16 */
        curve_point.x = FT_26D6_16D16( curve_point.x );
        curve_point.y = FT_26D6_16D16( curve_point.y );

        /* P(t) in the comment */
        dist_vector.x = curve_point.x - FT_26D6_16D16( p.x );
        dist_vector.y = curve_point.y - FT_26D6_16D16( p.y );

        length = VECTOR_LENGTH_16D16( dist_vector );

        if ( length < min )
        {
          min           = length;
          min_factor    = factor;
          nearest_point = curve_point;
        }

        /* This is Newton's approximation.          */
        /*                                          */
        /*   t := P(t) . B'(t) /                    */
        /*          (B'(t) . B'(t) + P(t) . B''(t)) */

        /* B'(t) = 2tA + B */
        d1.x = FT_MulFix( aA.x, 2 * factor ) + bB.x;
        d1.y = FT_MulFix( aA.y, 2 * factor ) + bB.y;

        /* B''(t) = 2A */
        d2.x = 2 * aA.x;
        d2.y = 2 * aA.y;

        dist_vector.x /= 1024;
        dist_vector.y /= 1024;

        /* temp1 = P(t) . B'(t) */
        temp1 = VEC_26D6_DOT( dist_vector, d1 );

        /* temp2 = B'(t) . B'(t) + P(t) . B''(t) */
        temp2 = VEC_26D6_DOT( d1, d1 ) +
                VEC_26D6_DOT( dist_vector, d2 );

        factor -= FT_DivFix( temp1, temp2 );

        if ( factor < 0 || factor > FT_INT_16D16( 1 ) )
          break;
      }
    }

    /* B'(t) = 2t * A + B */
    direction.x = 2 * FT_MulFix( aA.x, min_factor ) + bB.x;
    direction.y = 2 * FT_MulFix( aA.y, min_factor ) + bB.y;

    /* determine the sign */
    cross = FT_MulFix( nearest_point.x - FT_26D6_16D16( p.x ),
                       direction.y )                           -
            FT_MulFix( nearest_point.y - FT_26D6_16D16( p.y ),
                       direction.x );

    /* assign the values */
    out->distance = min;
    out->sign     = cross < 0 ? 1 : -1;

    if ( min_factor != 0 && min_factor != FT_INT_16D16( 1 ) )
      out->cross = FT_INT_16D16( 1 );   /* the two are perpendicular */
    else
    {
      /* convert to nearest vector */
      nearest_point.x -= FT_26D6_16D16( p.x );
      nearest_point.y -= FT_26D6_16D16( p.y );

      /* compute `cross` if not perpendicular */
      FT_Vector_NormLen( &direction );
      FT_Vector_NormLen( &nearest_point );

      out->cross = FT_MulFix( direction.x, nearest_point.y ) -
                   FT_MulFix( direction.y, nearest_point.x );
    }

  Exit:
    return error;
  }